

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O3

int c14nCommonTest(char *filename,int with_comments,int mode,char *subdir)

{
  int iVar1;
  uint size;
  char *pcVar2;
  size_t sVar3;
  char *__ptr;
  char *filename_00;
  undefined4 *puVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  undefined8 uVar12;
  long *plVar13;
  char *pcVar14;
  char *pcVar15;
  ulong uVar16;
  char *nslist;
  stat buf_1;
  char buf [500];
  char prefix [500];
  char *local_4d8;
  int local_4d0;
  int local_4cc;
  long local_4c8;
  int local_4bc;
  stat64 local_4b8;
  char local_428 [499];
  undefined1 local_235;
  undefined1 local_228 [504];
  
  local_4d0 = mode;
  local_4cc = with_comments;
  pcVar2 = baseFilename(filename);
  sVar3 = strlen(pcVar2);
  sVar3 = (size_t)((int)sVar3 + -4);
  memcpy(local_228,pcVar2,sVar3);
  local_228[sVar3] = 0;
  iVar1 = snprintf(local_428,499,"result/c14n/%s/%s",subdir,local_228);
  if (0x1f2 < iVar1) {
    local_235 = 0;
  }
  pcVar2 = strdup(local_428);
  iVar1 = snprintf(local_428,499,"test/c14n/%s/%s.xpath",subdir,local_228);
  if (0x1f2 < iVar1) {
    local_235 = 0;
  }
  iVar1 = stat64(local_428,&local_4b8);
  __ptr = (char *)0x0;
  if ((iVar1 != -1) && ((local_4b8.st_mode & 0xf000) == 0x8000)) {
    __ptr = strdup(local_428);
  }
  iVar1 = snprintf(local_428,499,"test/c14n/%s/%s.ns",subdir,local_228);
  if (0x1f2 < iVar1) {
    local_235 = 0;
  }
  iVar1 = stat64(local_428,&local_4b8);
  filename_00 = (char *)0x0;
  if ((iVar1 != -1) && ((local_4b8.st_mode & 0xf000) == 0x8000)) {
    filename_00 = strdup(local_428);
  }
  nb_tests = nb_tests + 1;
  local_4b8.st_dev = 0;
  local_4d8 = (char *)0x0;
  puVar4 = (undefined4 *)__xmlLoadExtDtdDefaultValue();
  *puVar4 = 6;
  xmlSubstituteEntitiesDefault(1);
  lVar5 = xmlReadFile(filename,0,10);
  if (lVar5 == 0) {
    fprintf(_stderr,"Error: unable to parse file \"%s\"\n",filename);
  }
  else {
    lVar6 = xmlDocGetRootElement(lVar5);
    if (lVar6 == 0) {
      fprintf(_stderr,"Error: empty document for file \"%s\"\n",filename);
      xmlFreeDoc(lVar5);
    }
    else {
      if (__ptr != (char *)0x0) {
        puVar4 = (undefined4 *)__xmlLoadExtDtdDefaultValue();
        *puVar4 = 6;
        xmlSubstituteEntitiesDefault(1);
        lVar6 = xmlReadFile(__ptr,0,10);
        if (lVar6 == 0) {
          fprintf(_stderr,"Error: unable to parse file \"%s\"\n",__ptr);
        }
        else {
          lVar7 = xmlDocGetRootElement(lVar6);
          if (lVar7 == 0) {
            fprintf(_stderr,"Error: empty document for file \"%s\"\n",__ptr);
            xmlFreeDoc(lVar6);
          }
          else {
            for (lVar7 = *(long *)(lVar6 + 0x18); lVar7 != 0; lVar7 = *(long *)(lVar7 + 0x30)) {
              iVar1 = xmlStrEqual(*(undefined8 *)(lVar7 + 0x10),"XPath");
              if (iVar1 != 0) {
                lVar8 = xmlNodeGetContent(lVar7);
                if (lVar8 == 0) {
                  fprintf(_stderr,"Error: XPath content element is NULL \"%s\"\n",__ptr);
                  xmlFreeDoc(lVar6);
                  goto LAB_0010ce7f;
                }
                lVar9 = xmlXPathNewContext(lVar5);
                if (lVar9 != 0) {
                  plVar13 = (long *)(lVar7 + 0x60);
                  goto LAB_0010cbda;
                }
                c14nCommonTest_cold_3();
                goto LAB_0010ce7f;
              }
            }
            fprintf(_stderr,"Error: XPath element expected in the file  \"%s\"\n",__ptr);
            xmlFreeDoc(lVar6);
          }
        }
        goto LAB_0010ce7f;
      }
      lVar7 = 0;
LAB_0010cc59:
      if (filename_00 == (char *)0x0) goto LAB_0010ce98;
      iVar1 = loadMem(filename_00,&local_4d8,&local_4bc);
      pcVar14 = local_4d8;
      if (iVar1 != 0) {
        c14nCommonTest_cold_5();
        goto LAB_0010cf3c;
      }
      if (local_4d8 == (char *)0x0) {
LAB_0010ce98:
        puVar11 = (undefined8 *)0x0;
      }
      else {
        iVar1 = xmlStrlen(local_4d8);
        if ((*pcVar14 == '\'') && (pcVar14[(long)iVar1 + -1] == '\'')) {
          pcVar14[(long)iVar1 + -1] = '\0';
          pcVar14 = pcVar14 + 1;
        }
        puVar10 = (undefined8 *)(*_xmlMalloc)(8000);
        if (puVar10 == (undefined8 *)0x0) {
          perror("malloc failed");
          goto LAB_0010ce98;
        }
        puVar11 = puVar10;
        if (*pcVar14 != '\0') {
          iVar1 = 1000;
          do {
            uVar16 = (long)puVar10 - (long)puVar11;
            if ((long)(iVar1 + -10) < (long)uVar16 >> 3) {
              iVar1 = iVar1 * 2;
              local_4c8 = lVar7;
              puVar11 = (undefined8 *)(*_xmlRealloc)(puVar11,(long)iVar1 << 3);
              if (puVar11 == (undefined8 *)0x0) {
                perror("realloc failed");
                puVar11 = (undefined8 *)0x0;
                lVar7 = local_4c8;
                goto LAB_0010ce9a;
              }
              puVar10 = puVar11 + (int)(uVar16 >> 3);
              lVar7 = local_4c8;
            }
            *puVar10 = pcVar14;
            puVar10 = puVar10 + 1;
            do {
              pcVar15 = pcVar14;
              pcVar14 = pcVar15 + 1;
              if (*pcVar15 == '\0') goto LAB_0010cd76;
            } while (*pcVar15 != ',');
            *pcVar15 = '\0';
          } while (*pcVar14 != '\0');
        }
LAB_0010cd76:
        *puVar10 = 0;
      }
LAB_0010ce9a:
      if (lVar7 == 0) {
        uVar12 = 0;
      }
      else {
        uVar12 = *(undefined8 *)(lVar7 + 8);
      }
      size = xmlC14NDocDumpMemory(lVar5,uVar12,local_4d0,puVar11,local_4cc,&local_4b8);
      if ((int)size < 0) {
        fprintf(_stderr,"Error: failed to canonicalize XML file \"%s\" (ret=%d)\n",filename,
                (ulong)size);
LAB_0010cfad:
        size = 0xffffffff;
LAB_0010cee8:
        if ((char *)local_4b8.st_dev != (char *)0x0) {
          (*_xmlFree)();
        }
      }
      else if ((char *)local_4b8.st_dev != (char *)0x0) {
        iVar1 = compareFileMem(pcVar2,(char *)local_4b8.st_dev,size);
        if (iVar1 != 0) {
          c14nCommonTest_cold_6();
          goto LAB_0010cfad;
        }
        goto LAB_0010cee8;
      }
      if (lVar7 != 0) {
        xmlXPathFreeObject(lVar7);
      }
      if (puVar11 != (undefined8 *)0x0) {
        (*_xmlFree)(puVar11);
      }
      if (local_4d8 != (char *)0x0) {
        free(local_4d8);
      }
      xmlFreeDoc(lVar5);
      iVar1 = 0;
      if (-1 < (int)size) goto LAB_0010cf41;
    }
  }
  goto LAB_0010cf3c;
  while (iVar1 = xmlXPathRegisterNs(lVar9,plVar13[3],plVar13[2]), iVar1 == 0) {
LAB_0010cbda:
    plVar13 = (long *)*plVar13;
    if (plVar13 == (long *)0x0) {
      lVar7 = xmlXPathEvalExpression(lVar8,lVar9);
      if (lVar7 != 0) {
        (*_xmlFree)(lVar8);
        xmlXPathFreeContext(lVar9);
        xmlFreeDoc(lVar6);
        goto LAB_0010cc59;
      }
      c14nCommonTest_cold_2();
      goto LAB_0010ce7f;
    }
  }
  c14nCommonTest_cold_1();
LAB_0010ce7f:
  c14nCommonTest_cold_4();
LAB_0010cf3c:
  iVar1 = 1;
LAB_0010cf41:
  if (pcVar2 != (char *)0x0) {
    free(pcVar2);
  }
  if (__ptr != (char *)0x0) {
    free(__ptr);
  }
  if (filename_00 != (char *)0x0) {
    free(filename_00);
  }
  return iVar1;
}

Assistant:

static int
c14nCommonTest(const char *filename, int with_comments, int mode,
               const char *subdir) {
    char buf[500];
    char prefix[500];
    const char *base;
    int len;
    char *result = NULL;
    char *xpath = NULL;
    char *ns = NULL;
    int ret = 0;

    base = baseFilename(filename);
    len = strlen(base);
    len -= 4;
    memcpy(prefix, base, len);
    prefix[len] = 0;

    if (snprintf(buf, 499, "result/c14n/%s/%s", subdir, prefix) >= 499)
        buf[499] = 0;
    result = strdup(buf);
    if (snprintf(buf, 499, "test/c14n/%s/%s.xpath", subdir, prefix) >= 499)
        buf[499] = 0;
    if (checkTestFile(buf)) {
	xpath = strdup(buf);
    }
    if (snprintf(buf, 499, "test/c14n/%s/%s.ns", subdir, prefix) >= 499)
        buf[499] = 0;
    if (checkTestFile(buf)) {
	ns = strdup(buf);
    }

    nb_tests++;
    if (c14nRunTest(filename, with_comments, mode,
                    xpath, ns, result) < 0)
        ret = 1;

    if (result != NULL) free(result);
    if (xpath != NULL) free(xpath);
    if (ns != NULL) free(ns);
    return(ret);
}